

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::ScopedPrematureExitFile::~ScopedPrematureExitFile(ScopedPrematureExitFile *this)

{
  pointer pcVar1;
  int iVar2;
  ostream *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  GTestLog local_24;
  
  if ((this->premature_exit_filepath_)._M_string_length != 0) {
    iVar2 = remove((this->premature_exit_filepath_)._M_dataplus._M_p);
    if (iVar2 != 0) {
      GTestLog::GTestLog(&local_24,GTEST_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest.cc"
                         ,0x11a2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to remove premature exit filepath \"",0x2a);
      this_00 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(this->premature_exit_filepath_)._M_dataplus._M_p,
                           (this->premature_exit_filepath_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"\" with error ",0xd);
      std::ostream::operator<<((ostream *)this_00,iVar2);
      GTestLog::~GTestLog(&local_24);
    }
  }
  pcVar1 = (this->premature_exit_filepath_)._M_dataplus._M_p;
  paVar3 = &(this->premature_exit_filepath_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~ScopedPrematureExitFile() {
    if (!premature_exit_filepath_.empty()) {
      int retval = remove(premature_exit_filepath_.c_str());
      if (retval) {
        GTEST_LOG_(ERROR) << "Failed to remove premature exit filepath \""
                          << premature_exit_filepath_ << "\" with error "
                          << retval;
      }
    }
  }